

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void aom_int_pro_col_avx2
               (int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  undefined1 (*pauVar5) [32];
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  switch(width << 0x1c | width - 0x10U >> 4) {
  case 0:
    lVar3 = (long)ref_stride;
    lVar4 = 0;
    do {
      auVar10._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 4) +
           ZEXT116(1) * *(undefined1 (*) [16])ref;
      auVar10._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 4);
      auVar11._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 5) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3);
      auVar11._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 5);
      auVar12._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 6) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 2);
      auVar12._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 6);
      auVar13._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 7) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 3);
      auVar13._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + lVar3 * 7);
      auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar10 = vpsadbw_avx2(auVar10,auVar8);
      auVar11 = vpsadbw_avx2(auVar11,auVar8);
      auVar12 = vpsadbw_avx2(auVar12,auVar8);
      auVar8 = vpsadbw_avx2(auVar13,auVar8);
      auVar13 = vpunpcklwd_avx2(auVar10,auVar11);
      auVar10 = vpunpckhwd_avx2(auVar10,auVar11);
      auVar11 = vpunpcklwd_avx2(auVar12,auVar8);
      auVar13 = vpunpckldq_avx2(auVar13,auVar11);
      auVar11 = vpunpckhwd_avx2(auVar12,auVar8);
      auVar10 = vpunpckldq_avx2(auVar10,auVar11);
      auVar10 = vpaddw_avx2(auVar13,auVar10);
      auVar10 = vpermq_avx2(auVar10,0xe8);
      auVar1 = vpsrlw_avx(auVar10._0_16_,ZEXT416((uint)norm_factor));
      *(undefined1 (*) [16])(vbuf + lVar4) = auVar1;
      ref = *(undefined1 (*) [16])ref + ref_stride * 8;
      lVar4 = lVar4 + 8;
    } while ((int)lVar4 < height);
    break;
  case 1:
    if (0 < height) {
      lVar3 = (long)ref_stride;
      lVar4 = 0;
      do {
        auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar10 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])ref);
        auVar11 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])(*(undefined1 (*) [32])ref + lVar3));
        auVar12 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])(*(undefined1 (*) [32])ref + lVar3 * 2))
        ;
        auVar8 = vpsadbw_avx2(auVar8,*(undefined1 (*) [32])(*(undefined1 (*) [32])ref + lVar3 * 3));
        auVar11 = vpslldq_avx2(auVar11,2);
        auVar10 = vpaddw_avx2(auVar11,auVar10);
        auVar11 = vpslldq_avx2(auVar12,4);
        auVar12 = vpslldq_avx2(auVar8,6);
        auVar11 = vpaddw_avx2(auVar11,auVar12);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar1 = vpaddw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddw_avx(auVar1,auVar2);
        auVar1 = vpsrlw_avx(auVar1,ZEXT416((uint)norm_factor));
        *(long *)(vbuf + lVar4) = auVar1._0_8_;
        ref = *(undefined1 (*) [32])ref + (ref_stride << 2);
        lVar4 = lVar4 + 4;
      } while ((int)lVar4 < height);
    }
    break;
  case 3:
    if (0 < height) {
      lVar3 = (long)ref_stride;
      pauVar5 = (undefined1 (*) [32])(ref + 0x20);
      lVar4 = 0;
      do {
        auVar7 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar10 = vpsadbw_avx2(auVar7,pauVar5[-1]);
        auVar11 = vpsadbw_avx2(auVar7,*pauVar5);
        auVar12 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(pauVar5[-1] + lVar3));
        auVar8 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(*pauVar5 + lVar3));
        auVar10 = vpaddw_avx2(auVar11,auVar10);
        auVar11 = vpaddw_avx2(auVar8,auVar12);
        auVar12 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(pauVar5[-1] + lVar3 * 2));
        auVar8 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(*pauVar5 + lVar3 * 2));
        auVar13 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(pauVar5[-1] + lVar3 * 3));
        auVar12 = vpaddw_avx2(auVar8,auVar12);
        auVar8 = vpsadbw_avx2(auVar7,*(undefined1 (*) [32])(*pauVar5 + lVar3 * 3));
        auVar8 = vpaddw_avx2(auVar8,auVar13);
        auVar11 = vpslldq_avx2(auVar11,2);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar11 = vpslldq_avx2(auVar12,4);
        auVar12 = vpslldq_avx2(auVar8,6);
        auVar11 = vpaddw_avx2(auVar11,auVar12);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar1 = vpaddw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddw_avx(auVar1,auVar2);
        auVar1 = vpsrlw_avx(auVar1,ZEXT416((uint)norm_factor));
        *(long *)(vbuf + lVar4) = auVar1._0_8_;
        lVar4 = lVar4 + 4;
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + (ref_stride << 2));
      } while ((int)lVar4 < height);
    }
    break;
  case 7:
    if (0 < height) {
      lVar4 = (long)ref_stride;
      lVar3 = lVar4 * 3;
      pauVar5 = (undefined1 (*) [32])(ref + 0x60);
      lVar6 = 0;
      do {
        auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar10 = vpsadbw_avx2(auVar9,pauVar5[-3]);
        auVar11 = vpsadbw_avx2(auVar9,pauVar5[-2]);
        auVar12 = vpsadbw_avx2(auVar9,pauVar5[-1]);
        auVar8 = vpsadbw_avx2(auVar9,*pauVar5);
        auVar10 = vpaddw_avx2(auVar11,auVar10);
        auVar11 = vpaddw_avx2(auVar12,auVar8);
        auVar12 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-3] + lVar4));
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar11 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-2] + lVar4));
        auVar11 = vpaddw_avx2(auVar11,auVar12);
        auVar12 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-1] + lVar4));
        auVar8 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(*pauVar5 + lVar4));
        auVar12 = vpaddw_avx2(auVar12,auVar8);
        auVar11 = vpaddw_avx2(auVar11,auVar12);
        auVar12 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-3] + lVar4 * 2));
        auVar8 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-2] + lVar4 * 2));
        auVar13 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-1] + lVar4 * 2));
        auVar12 = vpaddw_avx2(auVar8,auVar12);
        auVar8 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(*pauVar5 + lVar4 * 2));
        auVar8 = vpaddw_avx2(auVar13,auVar8);
        auVar13 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-3] + lVar3));
        auVar7 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-2] + lVar3));
        auVar12 = vpaddw_avx2(auVar12,auVar8);
        auVar8 = vpaddw_avx2(auVar7,auVar13);
        auVar13 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(pauVar5[-1] + lVar3));
        auVar7 = vpsadbw_avx2(auVar9,*(undefined1 (*) [32])(*pauVar5 + lVar3));
        auVar13 = vpaddw_avx2(auVar13,auVar7);
        auVar8 = vpaddw_avx2(auVar8,auVar13);
        auVar11 = vpslldq_avx2(auVar11,2);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar11 = vpslldq_avx2(auVar12,4);
        auVar12 = vpslldq_avx2(auVar8,6);
        auVar11 = vpaddw_avx2(auVar11,auVar12);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar1 = vpaddw_avx(auVar10._0_16_,auVar10._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddw_avx(auVar1,auVar2);
        auVar1 = vpsrlw_avx(auVar1,ZEXT416((uint)norm_factor));
        *(long *)(vbuf + lVar6) = auVar1._0_8_;
        lVar6 = lVar6 + 4;
        pauVar5 = (undefined1 (*) [32])(*pauVar5 + (ref_stride << 2));
      } while ((int)lVar6 < height);
    }
  }
  return;
}

Assistant:

void aom_int_pro_col_avx2(int16_t *vbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  assert(width % 16 == 0);
  if (width == 128) {
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[16];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);
      load_from_src_buf(ref + 32, &src[4], ref_stride);
      load_from_src_buf(ref + 64, &src[8], ref_stride);
      load_from_src_buf(ref + 96, &src[12], ref_stride);

      // Row0 output: r00 x x x r01 x x x | r02 x x x r03 x x x
      const __m256i s0 = _mm256_add_epi16(_mm256_sad_epu8(src[0], zero),
                                          _mm256_sad_epu8(src[4], zero));
      const __m256i s1 = _mm256_add_epi16(_mm256_sad_epu8(src[8], zero),
                                          _mm256_sad_epu8(src[12], zero));
      const __m256i r0 = _mm256_add_epi16(s0, s1);
      // Row1 output: r10 x x x r11 x x x | r12 x x x r13 x x x
      const __m256i s2 = _mm256_add_epi16(_mm256_sad_epu8(src[1], zero),
                                          _mm256_sad_epu8(src[5], zero));
      const __m256i s3 = _mm256_add_epi16(_mm256_sad_epu8(src[9], zero),
                                          _mm256_sad_epu8(src[13], zero));
      const __m256i r1 = _mm256_add_epi16(s2, s3);
      // Row2 output: r20 x x x r21 x x x | r22 x x x r23 x x x
      const __m256i s4 = _mm256_add_epi16(_mm256_sad_epu8(src[2], zero),
                                          _mm256_sad_epu8(src[6], zero));
      const __m256i s5 = _mm256_add_epi16(_mm256_sad_epu8(src[10], zero),
                                          _mm256_sad_epu8(src[14], zero));
      const __m256i r2 = _mm256_add_epi16(s4, s5);
      // Row3 output: r30 x x x r31 x x x | r32 x x x r33 x x x
      const __m256i s6 = _mm256_add_epi16(_mm256_sad_epu8(src[3], zero),
                                          _mm256_sad_epu8(src[7], zero));
      const __m256i s7 = _mm256_add_epi16(_mm256_sad_epu8(src[11], zero),
                                          _mm256_sad_epu8(src[15], zero));
      const __m256i r3 = _mm256_add_epi16(s6, s7);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 64) {
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[8];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);
      load_from_src_buf(ref + 32, &src[4], ref_stride);

      // Row0 output: r00 x x x r01 x x x | r02 x x x r03 x x x
      const __m256i s0 = _mm256_sad_epu8(src[0], zero);
      const __m256i s1 = _mm256_sad_epu8(src[4], zero);
      const __m256i r0 = _mm256_add_epi16(s0, s1);
      // Row1 output: r10 x x x r11 x x x | r12 x x x r13 x x x
      const __m256i s2 = _mm256_sad_epu8(src[1], zero);
      const __m256i s3 = _mm256_sad_epu8(src[5], zero);
      const __m256i r1 = _mm256_add_epi16(s2, s3);
      // Row2 output: r20 x x x r21 x x x | r22 x x x r23 x x x
      const __m256i s4 = _mm256_sad_epu8(src[2], zero);
      const __m256i s5 = _mm256_sad_epu8(src[6], zero);
      const __m256i r2 = _mm256_add_epi16(s4, s5);
      // Row3 output: r30 x x x r31 x x x | r32 x x x r33 x x x
      const __m256i s6 = _mm256_sad_epu8(src[3], zero);
      const __m256i s7 = _mm256_sad_epu8(src[7], zero);
      const __m256i r3 = _mm256_add_epi16(s6, s7);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 32) {
    assert(height % 2 == 0);
    const __m256i zero = _mm256_setzero_si256();
    for (int ht = 0; ht < height; ht += 4) {
      __m256i src[4];
      // Load source data.
      load_from_src_buf(ref, &src[0], ref_stride);

      // s00 x x x s01 x x x s02 x x x s03 x x x
      const __m256i r0 = _mm256_sad_epu8(src[0], zero);
      // s10 x x x s11 x x x s12 x x x s13 x x x
      const __m256i r1 = _mm256_sad_epu8(src[1], zero);
      // s20 x x x s21 x x x s22 x x x s23 x x x
      const __m256i r2 = _mm256_sad_epu8(src[2], zero);
      // s30 x x x s31 x x x s32 x x x s33 x x x
      const __m256i r3 = _mm256_sad_epu8(src[3], zero);

      CALC_TOT_SAD_AND_STORE
      vbuf += 4;
      ref += ref_stride << 2;
    }
  } else if (width == 16) {
    aom_int_pro_col_16wd_avx2(vbuf, ref, ref_stride, height, norm_factor);
  }
}